

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::StatusErrorListener::MissingField
          (StatusErrorListener *this,LocationTrackerInterface *loc,StringPiece missing_name)

{
  stringpiece_ssize_type sVar1;
  AlphaNum *in_R8;
  StringPiece error_message;
  AlphaNum local_148;
  pointer local_118;
  size_type sStack_110;
  undefined1 local_e8 [8];
  StringPiece missing_name_local;
  string local_a8;
  undefined1 local_88 [40];
  string local_60;
  string local_40;
  
  missing_name_local.ptr_ = (char *)missing_name.length_;
  local_e8 = (undefined1  [8])missing_name.ptr_;
  (anonymous_namespace)::StatusErrorListener::GetLocString_abi_cxx11_
            (&local_a8,loc,(LocationTrackerInterface *)local_e8);
  local_118 = local_a8._M_dataplus._M_p;
  sStack_110 = local_a8._M_string_length;
  missing_name_local.length_ = (stringpiece_ssize_type)anon_var_dwarf_4b8131;
  StringPiece::ToString_abi_cxx11_(&local_60,(StringPiece *)local_e8);
  local_148.piece_data_ = local_60._M_dataplus._M_p;
  local_148.piece_size_ = local_60._M_string_length;
  StrCat_abi_cxx11_(&local_40,(protobuf *)&local_118,(AlphaNum *)&missing_name_local.length_,
                    &local_148,in_R8);
  sVar1 = StringPiece::CheckedSsizeTFromSizeT(local_40._M_string_length);
  error_message.length_ = sVar1;
  error_message.ptr_ = local_40._M_dataplus._M_p;
  Status::Status((Status *)local_88,INVALID_ARGUMENT,error_message);
  Status::operator=(&this->status_,(Status *)local_88);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void MissingField(const converter::LocationTrackerInterface& loc,
                    StringPiece missing_name) override {
    status_ = util::Status(util::error::INVALID_ARGUMENT,
                             StrCat(GetLocString(loc), ": missing field ",
                                          std::string(missing_name)));
  }